

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseLifLayer.cpp
# Opt level: O0

ILayer * __thiscall DenseLifLayer::LogBasicStats(DenseLifLayer *this)

{
  INeuron *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *this_01;
  reference ppIVar4;
  ISynapses *this_02;
  reference ppIVar5;
  float sample;
  Potential PVar6;
  float sample_00;
  float local_54;
  value_type synapse;
  const_iterator __end2;
  const_iterator __begin2;
  ISynapses *__range2;
  INeuron *neuron;
  iterator __end1;
  iterator __begin1;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *__range1;
  DenseLifLayer *this_local;
  
  sVar3 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::size(&(this->super_ILayer).neurons);
  local_54 = (float)sVar3;
  Stat<float>::SetRef(&(this->super_ILayer).stats.synapseWeight,1.0 / local_54);
  this_01 = &(this->super_ILayer).neurons;
  __end1 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::begin(this_01);
  neuron = (INeuron *)std::vector<INeuron_*,_std::allocator<INeuron_*>_>::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>
                                     *)&neuron), bVar1) {
    ppIVar4 = __gnu_cxx::
              __normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>::
              operator*(&__end1);
    this_00 = *ppIVar4;
    (*this_00->_vptr_INeuron[0xb])();
    Stat<float>::Add(&(this->super_ILayer).stats.neuronMPMax,sample);
    PVar6 = INeuron::GetPotential(this_00);
    Stat<float>::Add(&(this->super_ILayer).stats.neuronMP,PVar6);
    PVar6 = INeuron::GetInduced(this_00);
    Stat<float>::Add(&(this->super_ILayer).stats.neuronMPInduced,PVar6);
    iVar2 = INeuron::GetInductionAffectedSpikes(this_00);
    Stat<int>::Add(&(this->super_ILayer).stats.inducedSpikes,iVar2);
    this_02 = INeuron::GetOutputSynapses(this_00);
    __end2 = std::
             unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
             ::begin(this_02);
    synapse = (value_type)
              std::
              unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
              ::end(this_02);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<ISynapse_*,_false>,
                              (_Node_iterator_base<ISynapse_*,_false> *)&synapse), bVar1) {
      ppIVar5 = std::__detail::_Node_const_iterator<ISynapse_*,_true,_false>::operator*(&__end2);
      (*(*ppIVar5)->_vptr_ISynapse[1])();
      Stat<float>::Add(&(this->super_ILayer).stats.synapseWeight,sample_00);
      std::__detail::_Node_const_iterator<ISynapse_*,_true,_false>::operator++(&__end2);
    }
    iVar2 = INeuron::GetOutputSpikeCounter(this_00);
    Stat<int>::Add(&(this->super_ILayer).stats.spikes,iVar2);
    __gnu_cxx::__normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>::
    operator++(&__end1);
  }
  return &this->super_ILayer;
}

Assistant:

ILayer &DenseLifLayer::LogBasicStats()
{
    stats.synapseWeight.SetRef( 1.f / neurons.size());
    for ( auto neuron : neurons ) {
        stats.neuronMPMax.Add( neuron->GetMaxMP());
        stats.neuronMP.Add( neuron->GetPotential());
        stats.neuronMPInduced.Add( neuron->GetInduced());
        stats.inducedSpikes.Add( neuron->GetInductionAffectedSpikes());
        for ( auto synapse : neuron->GetOutputSynapses()) {
            stats.synapseWeight.Add( synapse->GetStrength());
        }
        stats.spikes.Add( neuron->GetOutputSpikeCounter());
    }
    return *this;
}